

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::AddLink(ChAssembly *this,shared_ptr<chrono::ChLinkBase> *link)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<chrono::ChLinkBase>_*,_std::vector<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>_>
  _Var2;
  
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChLinkBase>*,std::vector<std::shared_ptr<chrono::ChLinkBase>,std::allocator<std::shared_ptr<chrono::ChLinkBase>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChLinkBase>const>>
                    ((this->linklist).
                     super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->linklist).
                     super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,link);
  if (_Var2._M_current ==
      (this->linklist).
      super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar1 = (link->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])
              (peVar1,(this->super_ChPhysicsItem).system);
    std::
    vector<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
    ::push_back(&this->linklist,link);
    ((this->super_ChPhysicsItem).system)->is_updated = false;
    return;
  }
  __assert_fail("std::find(std::begin(linklist), std::end(linklist), link) == linklist.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xc0,"void chrono::ChAssembly::AddLink(std::shared_ptr<ChLinkBase>)");
}

Assistant:

void ChAssembly::AddLink(std::shared_ptr<ChLinkBase> link) {
    assert(std::find(std::begin(linklist), std::end(linklist), link) == linklist.end());

    link->SetSystem(system);
    linklist.push_back(link);

	////system->is_initialized = false;  // Not needed, unless/until ChLink::SetupInitial does something
    system->is_updated = false;
}